

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O1

void avro::codec_traits<uau::_union_array_union_Union__0__>::encode
               (Encoder *e,_union_array_union_Union__0__ *v)

{
  int32_t iVar1;
  undefined8 extraout_RDX;
  
  (**(code **)(*(long *)e + 0xa0))(e,v->idx_);
  if (v->idx_ == 1) {
    iVar1 = uau::_union_array_union_Union__0__::get_int(v);
    (**(code **)(*(long *)e + 0x30))(e,iVar1,extraout_RDX,*(code **)(*(long *)e + 0x30));
    return;
  }
  if (v->idx_ == 0) {
    (**(code **)(*(long *)e + 0x20))(e);
    return;
  }
  return;
}

Assistant:

static void encode(Encoder& e, uau::_union_array_union_Union__0__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            e.encodeNull();
            break;
        case 1:
            avro::encode(e, v.get_int());
            break;
        }
    }